

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

void __thiscall
draco::Encoder::SetAttributeExplicitQuantization
          (Encoder *this,Type type,int quantization_bits,int num_dims,float *origin,float range)

{
  EncoderOptionsBase<draco::GeometryAttribute::Type> *att_key;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *pEVar1;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *in_RDI;
  undefined8 in_stack_ffffffffffffff18;
  int val;
  float val_00;
  string *in_stack_ffffffffffffff20;
  string *name;
  AttributeKey *in_stack_ffffffffffffff28;
  DracoOptions<draco::GeometryAttribute::Type> *in_stack_ffffffffffffff30;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 local_81 [56];
  allocator<char> local_49;
  string local_48 [72];
  
  val = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeInt
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,val);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  att_key = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options(in_RDI)
  ;
  this_00 = (DracoOptions<draco::GeometryAttribute::Type> *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeVector<float>
            (this_00,(AttributeKey *)att_key,in_stack_ffffffffffffff20,val,(float *)0x156872);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  pEVar1 = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options(in_RDI);
  val_00 = (float)((ulong)pEVar1 >> 0x20);
  name = (string *)&stack0xffffffffffffff57;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeFloat
            (this_00,(AttributeKey *)att_key,name,val_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  return;
}

Assistant:

void Encoder::SetAttributeExplicitQuantization(GeometryAttribute::Type type,
                                               int quantization_bits,
                                               int num_dims,
                                               const float *origin,
                                               float range) {
  options().SetAttributeInt(type, "quantization_bits", quantization_bits);
  options().SetAttributeVector(type, "quantization_origin", num_dims, origin);
  options().SetAttributeFloat(type, "quantization_range", range);
}